

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O0

int32_t ecs_column_index_from_name(ecs_iter_t *it,char *name)

{
  int32_t iVar1;
  int iVar2;
  void *pvVar3;
  int32_t local_2c;
  int32_t count;
  int32_t i;
  ecs_sig_column_t *column;
  char *name_local;
  ecs_iter_t *it_local;
  
  if (it->query != (ecs_query_t *)0x0) {
    iVar1 = ecs_vector_count((it->query->sig).columns);
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar3 = _ecs_vector_get((it->query->sig).columns,0x28,0x10,local_2c);
      if ((*(long *)((long)pvVar3 + 0x20) != 0) &&
         (iVar2 = strcmp(name,*(char **)((long)pvVar3 + 0x20)), iVar2 == 0)) {
        return local_2c + 1;
      }
    }
  }
  return 0;
}

Assistant:

int32_t ecs_column_index_from_name(
    const ecs_iter_t *it,
    const char *name)
{
    ecs_sig_column_t *column = NULL;
    if (it->query) {
        int32_t i, count = ecs_vector_count(it->query->sig.columns);
        for (i = 0; i < count; i ++) {
            column = ecs_vector_get(
                it->query->sig.columns, ecs_sig_column_t, i);
            if (column->name) {
                if (!strcmp(name, column->name)) {
                    return i + 1;
                }
            }
        }
    }

    return 0;
}